

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void flatbuffers::python::anon_unknown_0::PythonStubGenerator::DeclareUOffset
               (stringstream *stub,Imports *imports)

{
  Imports *this;
  ostream *poVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Imports *local_18;
  Imports *imports_local;
  stringstream *stub_local;
  
  local_18 = imports;
  imports_local = (Imports *)stub;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"flatbuffers",&local_39);
  Imports::Import(imports,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"typing",&local_71);
  Imports::Import(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  poVar1 = std::operator<<((ostream *)
                           &(imports_local->imports).
                            super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "uoffset: typing.TypeAlias = flatbuffers.number_types.UOffsetTFlags.py_type\n"
                          );
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

static void DeclareUOffset(std::stringstream &stub, Imports *imports) {
    imports->Import("flatbuffers");
    imports->Import("typing");
    stub << "uoffset: typing.TypeAlias = "
            "flatbuffers.number_types.UOffsetTFlags.py_type\n"
         << '\n';
  }